

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O1

string * __thiscall
cmCPackIFWPackage::DependenceStruct::NameWithCompare_abi_cxx11_
          (string *__return_storage_ptr__,DependenceStruct *this)

{
  uint uVar1;
  pointer pcVar2;
  
  uVar1 = (this->Compare).Type;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->Name)._M_string_length);
  if (uVar1 != 0) {
    if ((this->Compare).Type - 1 < 5) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(this->Compare).Value._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWPackage::DependenceStruct::NameWithCompare() const
{
  if (Compare.Type == CompareNone) return Name;

  std::string result = Name;

  if (Compare.Type == CompareLessOrEqual)
    {
    result += "<=";
    }
  else if (Compare.Type == CompareGreaterOrEqual)
    {
    result += ">=";
    }
  else if (Compare.Type == CompareLess)
    {
    result += "<";
    }
  else if (Compare.Type == CompareEqual)
    {
    result += "=";
    }
  else if (Compare.Type == CompareGreater)
    {
    result += ">";
    }

  result += Compare.Value;

  return result;
}